

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

void __thiscall
slang::ast::UnpackedStructType::UnpackedStructType
          (UnpackedStructType *this,Compilation *compilation,SourceLocation loc,ASTContext *context)

{
  int iVar1;
  SymbolIndex SVar2;
  
  (this->super_Type).super_Symbol.kind = UnpackedStructType;
  (this->super_Type).super_Symbol.name._M_len = 0;
  (this->super_Type).super_Symbol.name._M_str = "";
  (this->super_Type).super_Symbol.location = loc;
  (this->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Type).super_Symbol.parentScope = (Scope *)0x0;
  (this->super_Type).super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_Type).super_Symbol.indexInScope = 0;
  (this->super_Type).canonical = &this->super_Type;
  Scope::Scope(&this->super_Scope,compilation,(Symbol *)this);
  this->selectableWidth = 0;
  this->bitstreamWidth = 0;
  (this->fields)._M_ptr = (pointer)0x0;
  (this->fields)._M_extent._M_extent_value = 0;
  iVar1 = compilation->nextStructSystemId;
  compilation->nextStructSystemId = iVar1 + 1;
  this->systemId = iVar1;
  SVar2 = context->lookupIndex;
  (this->super_Type).super_Symbol.parentScope = (context->scope).ptr;
  (this->super_Type).super_Symbol.indexInScope = SVar2;
  return;
}

Assistant:

UnpackedStructType::UnpackedStructType(Compilation& compilation, SourceLocation loc,
                                       const ASTContext& context) :
    Type(SymbolKind::UnpackedStructType, "", loc), Scope(compilation, this),
    systemId(compilation.getNextStructSystemId()) {

    // Struct types don't live as members of the parent scope (they're "owned" by
    // the declaration containing them) but we hook up the parent pointer so that
    // it can participate in name lookups.
    setParent(*context.scope, context.lookupIndex);
}